

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O1

void __thiscall
kainjow::mustache::
parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::parse
          (parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input,
          context_internal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *ctx,component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *root_component,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *error_message)

{
  component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pcVar1;
  pointer pcVar2;
  size_type sVar3;
  pointer pcVar4;
  context_internal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pcVar5;
  pointer pbVar6;
  bool bVar7;
  int iVar8;
  walk_control wVar9;
  long *plVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  delimiter_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__p;
  ostream *poVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  undefined8 uVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  ulong uVar15;
  component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *child
  ;
  component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pcVar16;
  pointer pcVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  pointer pbVar21;
  bool bVar22;
  initializer_list<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  string_size_type input_position;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tag_contents;
  vector<unsigned_long,_std::allocator<unsigned_long>_> section_starts;
  vector<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
  sections;
  string_size_type current_text_position;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> brace_delimiter_end_unescaped;
  component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> comp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> current_text;
  anon_class_24_3_f3e5c141 process_current_text;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  whitespace;
  component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> comp_1
  ;
  bool local_371;
  pointer local_370;
  component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_338;
  component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_330;
  delimiter_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_328;
  context_internal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_320;
  void *local_318;
  iterator iStack_310;
  unsigned_long *local_308;
  vector<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
  local_300;
  parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_2e8;
  pointer local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  undefined1 local_2b8 [88];
  element_type *local_260;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_258;
  vector<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_250;
  component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  long *local_210 [2];
  long local_200 [2];
  component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1f0;
  component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1e8;
  size_type local_1e0;
  anon_class_24_3_f3e5c141 local_1d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  _Any_data local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_158;
  undefined8 local_150;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_148;
  undefined1 local_140 [8];
  undefined1 auStack_138 [16];
  component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_128 [2];
  component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  local_338 = error_message;
  local_2e8 = this;
  std::__cxx11::string::_M_construct((ulong)&local_2d8,'\x03');
  pcVar16 = (component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)input->_M_string_length;
  local_328 = &ctx->delim_set;
  local_320 = ctx;
  local_371 = delimiter_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::is_default(local_328);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_1a8;
  local_1a8._M_unused._M_object = root_component;
  Catch::clara::std::
  vector<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
  ::vector(&local_300,__l,(allocator_type *)local_2b8);
  local_308 = (unsigned_long *)0x0;
  local_318 = (void *)0x0;
  iStack_310._M_current = (unsigned_long *)0x0;
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  local_230._M_string_length = 0;
  local_230.field_2._M_local_buf[0] = '\0';
  local_2e0 = (component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0xffffffffffffffff;
  local_330 = pcVar16;
  std::__cxx11::string::reserve((ulong)&local_230);
  local_1d8.current_text_position = (string_size_type *)&local_2e0;
  local_2b8._0_8_ = local_2b8 + 0x10;
  local_1d8.current_text = &local_230;
  local_1d8.sections = &local_300;
  std::__cxx11::string::_M_construct((ulong)local_2b8,'\x01');
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_360,'\x01');
  uVar19 = 0xf;
  if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
    uVar19 = CONCAT71(local_2b8._17_7_,local_2b8[0x10]);
  }
  local_1f0 = root_component;
  if (uVar19 < local_360._M_string_length + local_2b8._8_8_) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      uVar14 = local_360.field_2._M_allocated_capacity;
    }
    if (local_360._M_string_length + local_2b8._8_8_ <= (ulong)uVar14) {
      plVar10 = (long *)std::__cxx11::string::replace
                                  ((ulong)&local_360,0,(char *)0x0,local_2b8._0_8_);
      goto LAB_001dcd90;
    }
  }
  plVar10 = (long *)std::__cxx11::string::_M_append(local_2b8,(ulong)local_360._M_dataplus._M_p);
LAB_001dcd90:
  local_1a8._M_unused._M_object = &local_198;
  pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar10 + 2);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar10 == pbVar13) {
    local_198._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
    local_198._M_string_length = plVar10[3];
  }
  else {
    local_198._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
    local_1a8._M_unused._M_object =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar10;
  }
  local_1a8._8_8_ = plVar10[1];
  *plVar10 = (long)pbVar13;
  plVar10[1] = 0;
  *(undefined1 *)&(pbVar13->_M_dataplus)._M_p = 0;
  local_198.field_2._M_allocated_capacity = (size_type)&local_178;
  std::__cxx11::string::_M_construct((ulong)&local_198.field_2,'\x01');
  local_178.field_2._M_allocated_capacity = (size_type)&_Stack_158;
  std::__cxx11::string::_M_construct((ulong)&local_178.field_2,'\x01');
  _Stack_148._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_138;
  std::__cxx11::string::_M_construct((ulong)&_Stack_148,'\x01');
  pcVar16 = &local_118;
  local_128[0] = pcVar16;
  std::__cxx11::string::_M_construct((ulong)local_128,'\x01');
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&local_1a8;
  Catch::clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1c0,__l_00,(allocator_type *)local_210);
  lVar20 = -0xa0;
  do {
    pcVar1 = pcVar16[-1].children.
             super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (pcVar16 != pcVar1) {
      operator_delete(pcVar1,(ulong)((pcVar16->text)._M_dataplus._M_p + 1));
    }
    pcVar16 = (component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&pcVar16[-1].children;
    lVar20 = lVar20 + 0x20;
  } while (lVar20 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
    operator_delete((void *)local_2b8._0_8_,CONCAT71(local_2b8._17_7_,local_2b8[0x10]) + 1);
  }
  local_370 = (component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x0;
  if (local_330 !=
      (component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
      )0x0) {
    local_1e8 = (component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&local_330[-1].position + 6);
    local_340 = input;
    do {
      pbVar13 = local_340;
      iVar8 = std::__cxx11::string::compare
                        ((ulong)local_340,(ulong)local_370,
                         (string *)(local_320->delim_set).begin._M_string_length);
      pbVar6 = local_1c0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar8 == 0) {
        parse::anon_class_24_3_f3e5c141::operator()(&local_1d8);
      }
      else {
        if (local_1c0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_1c0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          local_368 = (component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)CONCAT44(local_368._4_4_,iVar8);
          bVar22 = false;
          pbVar21 = local_1c0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            iVar8 = std::__cxx11::string::compare
                              ((ulong)pbVar13,(ulong)local_370,(string *)pbVar21->_M_string_length);
            if (iVar8 == 0) {
              parse::anon_class_24_3_f3e5c141::operator()(&local_1d8);
              pcVar17 = local_370;
              pcVar2 = (pbVar21->_M_dataplus)._M_p;
              local_1a8._M_unused._M_object = &local_198;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1a8,pcVar2,pcVar2 + pbVar21->_M_string_length);
              local_198.field_2._M_allocated_capacity = (size_type)&local_178;
              local_198.field_2._8_8_ = 0;
              local_178._M_dataplus._M_p._0_1_ = 0;
              local_178.field_2._M_allocated_capacity =
                   local_178.field_2._M_allocated_capacity & 0xffffffff00000000;
              auStack_138._8_8_ = (pointer)0x0;
              local_140 = (undefined1  [8])0x0;
              auStack_138._0_8_ = (pointer)0x0;
              local_150 = 0;
              _Stack_148._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_178.field_2._8_8_ = 0;
              _Stack_158._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_128[0] = pcVar17;
              Catch::clara::std::
              vector<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::push_back(&local_300.
                           super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish[-1]->children,
                          (value_type *)&local_1a8);
              local_370 = (pointer)((long)&(local_370->text)._M_dataplus._M_p +
                                   pbVar21->_M_string_length);
              Catch::clara::std::
              vector<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~vector((vector<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_140);
              if (_Stack_148._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (_Stack_148._M_pi);
              }
              if (_Stack_158._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (_Stack_158._M_pi);
              }
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_198.field_2._M_allocated_capacity != &local_178) {
                operator_delete((void *)local_198.field_2._M_allocated_capacity,
                                CONCAT71(local_178._M_dataplus._M_p._1_7_,
                                         local_178._M_dataplus._M_p._0_1_) + 1);
              }
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_1a8._M_unused._0_8_ != &local_198) {
                operator_delete(local_1a8._M_unused._M_object,
                                (ulong)(local_198._M_dataplus._M_p + 1));
              }
              bVar22 = true;
            }
          } while ((iVar8 != 0) && (pbVar21 = pbVar21 + 1, pbVar13 = local_340, pbVar21 != pbVar6));
          iVar8 = (int)local_368;
          if (bVar22) goto LAB_001dd119;
        }
        if (local_230._M_string_length == 0) {
          local_2e0 = local_370;
        }
        std::__cxx11::string::_M_replace_aux((ulong)&local_230,local_230._M_string_length,0,'\x01');
        local_370 = (pointer)((long)&(local_370->text)._M_dataplus._M_p + 1);
      }
LAB_001dd119:
      pbVar13 = local_340;
      iVar18 = 3;
      if (iVar8 == 0) {
        sVar3 = (local_320->delim_set).begin._M_string_length;
        uVar19 = (long)&(local_370->text)._M_dataplus._M_p + sVar3;
        local_368 = local_370;
        if ((local_370 != local_1e8 & local_371) == 1) {
          uVar15 = local_340->_M_string_length;
          if (uVar15 <= uVar19) {
LAB_001dd871:
            uVar14 = std::__throw_out_of_range_fmt
                               ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)"
                                ,uVar19,uVar15);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8._M_pod_data);
            std::ios_base::~ios_base((ios_base *)auStack_138);
            component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~component((component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_2b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p != &local_360.field_2) {
              operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1
                             );
            }
            Catch::clara::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_1c0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p != &local_230.field_2) {
              operator_delete(local_230._M_dataplus._M_p,
                              CONCAT71(local_230.field_2._M_allocated_capacity._1_7_,
                                       local_230.field_2._M_local_buf[0]) + 1);
            }
            if (local_318 != (void *)0x0) {
              operator_delete(local_318,(long)local_308 - (long)local_318);
            }
            if (local_300.
                super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_300.
                              super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_300.
                                    super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_300.
                                    super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
              operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1
                             );
            }
            _Unwind_Resume(uVar14);
          }
          if (sVar3 == 0) {
            uVar19 = 0;
            uVar15 = 0;
            goto LAB_001dd871;
          }
          bVar22 = (local_340->_M_dataplus)._M_p[uVar19] == *(local_328->begin)._M_dataplus._M_p;
        }
        else {
          bVar22 = false;
        }
        uVar19 = uVar19 + bVar22;
        pbVar11 = &(local_320->delim_set).end;
        if (bVar22 != false) {
          pbVar11 = &local_2d8;
        }
        local_1e0 = pbVar11->_M_string_length;
        pbVar11 = &(local_320->delim_set).end;
        if (bVar22 != false) {
          pbVar11 = &local_2d8;
        }
        lVar20 = std::__cxx11::string::find
                           ((char *)local_340,(ulong)(pbVar11->_M_dataplus)._M_p,uVar19);
        if (lVar20 == -1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8._M_pod_data);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8._M_pod_data,"Unclosed tag at ",0x10);
          std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::operator=((string *)local_338,(string *)local_2b8);
          if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
            operator_delete((void *)local_2b8._0_8_,CONCAT71(local_2b8._17_7_,local_2b8[0x10]) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8._M_pod_data);
          std::ios_base::~ios_base((ios_base *)auStack_138);
          iVar18 = 1;
        }
        else {
          std::__cxx11::string::string
                    ((string *)local_1a8._M_pod_data,(string *)pbVar13,uVar19,lVar20 - uVar19);
          trim<std::__cxx11::string>(&local_360,(mustache *)local_1a8._M_pod_data,s);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_1a8._M_unused._0_8_ != &local_198) {
            operator_delete(local_1a8._M_unused._M_object,(ulong)(local_198._M_dataplus._M_p + 1));
          }
          local_2b8._0_8_ = local_2b8 + 0x10;
          local_2b8._8_8_ = 0;
          local_2b8[0x10] = '\0';
          local_2b8._32_8_ = local_2b8 + 0x30;
          local_2b8._40_8_ = 0;
          local_2b8[0x30] = '\0';
          local_2b8._64_4_ = text;
          local_250.
          super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_250.
          super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_250.
          super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_260 = (element_type *)0x0;
          _Stack_258._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_2b8._72_8_ = (element_type *)0x0;
          local_2b8._80_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_238 = (component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0xffffffffffffffff;
          if ((local_360._M_string_length == 0) || (*local_360._M_dataplus._M_p != '=')) {
LAB_001dd374:
            if (local_2b8._64_4_ != set_delimiter) {
              parse_tag_contents(local_2e8,bVar22,&local_360,
                                 (mstch_tag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)(local_2b8 + 0x20));
            }
            local_238 = local_368;
            Catch::clara::std::
            vector<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::push_back(&local_300.
                         super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish[-1]->children,
                        (value_type *)local_2b8);
            local_370 = (pointer)(lVar20 + local_1e0);
            iVar18 = 0;
            if (local_2b8._64_4_ == section_begin_inverted) {
LAB_001dd3f1:
              local_1a8._M_unused._M_object =
                   (local_300.
                    super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1]->children).
                   super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1;
              std::
              vector<kainjow::mustache::component<std::__cxx11::string>*,std::allocator<kainjow::mustache::component<std::__cxx11::string>*>>
              ::emplace_back<kainjow::mustache::component<std::__cxx11::string>*>
                        ((vector<kainjow::mustache::component<std::__cxx11::string>*,std::allocator<kainjow::mustache::component<std::__cxx11::string>*>>
                          *)&local_300,
                         (component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          **)&local_1a8);
              if (iStack_310._M_current == local_308) {
                std::vector<unsigned_long,std::allocator<unsigned_long>>::
                _M_realloc_insert<unsigned_long_const&>
                          ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_318,
                           iStack_310,(unsigned_long *)&local_370);
                iVar18 = 0;
              }
              else {
                *iStack_310._M_current = (unsigned_long)local_370;
                iStack_310._M_current = iStack_310._M_current + 1;
              }
            }
            else if (local_2b8._64_4_ == section_end) {
              if ((long)local_300.
                        super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_300.
                        super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                        ._M_impl.super__Vector_impl_data._M_start == 8) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8._M_pod_data);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8._M_pod_data,"Unopened section \"",0x12);
                poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1a8._M_pod_data,(char *)local_2b8._32_8_,
                                     local_2b8._40_8_);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\" at ",5);
                std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
                std::__cxx11::stringbuf::str();
                goto LAB_001dd5f3;
              }
              pcVar16 = local_300.
                        super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish[-1];
              pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        operator_new(0x20);
              std::__cxx11::string::substr((ulong)pbVar13,(ulong)local_340);
              std::__shared_ptr<std::__cxx11::string,(__gnu_cxx::_Lock_policy)2>::
              reset<std::__cxx11::string>
                        ((__shared_ptr<std::__cxx11::string,(__gnu_cxx::_Lock_policy)2> *)
                         &(pcVar16->tag).section_text,pbVar13);
              local_300.
              super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_300.
                   super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1;
              iStack_310._M_current = iStack_310._M_current + -1;
              iVar18 = 0;
            }
            else if (local_2b8._64_4_ == section_begin) goto LAB_001dd3f1;
          }
          else {
            bVar7 = parse_set_delimiter_tag(local_2e8,&local_360,local_328);
            if (bVar7) {
              local_371 = delimiter_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::is_default(local_328);
              local_2b8._64_4_ = set_delimiter;
              __p = (delimiter_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)operator_new(0x40);
              pcVar5 = local_320;
              (__p->begin)._M_dataplus._M_p = (pointer)&(__p->begin).field_2;
              pcVar2 = (local_320->delim_set).begin._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)__p,pcVar2,pcVar2 + (local_320->delim_set).begin._M_string_length
                        );
              (__p->end)._M_dataplus._M_p = (pointer)&(__p->end).field_2;
              pcVar2 = (pcVar5->delim_set).end._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&__p->end,pcVar2,
                         pcVar2 + (pcVar5->delim_set).end._M_string_length);
              std::
              __shared_ptr<kainjow::mustache::delimiter_set<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
              ::reset<kainjow::mustache::delimiter_set<std::__cxx11::string>>
                        ((__shared_ptr<kainjow::mustache::delimiter_set<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
                          *)&local_260,__p);
              goto LAB_001dd374;
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8._M_pod_data);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8._M_pod_data,"Invalid set delimiter tag at ",0x1d);
            std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
            std::__cxx11::stringbuf::str();
LAB_001dd5f3:
            std::__cxx11::string::operator=((string *)local_338,(string *)local_210);
            if (local_210[0] != local_200) {
              operator_delete(local_210[0],local_200[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8._M_pod_data);
            std::ios_base::~ios_base((ios_base *)auStack_138);
            iVar18 = 1;
          }
          Catch::clara::std::
          vector<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector(&local_250);
          if (_Stack_258._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (_Stack_258._M_pi);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._80_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._80_8_);
          }
          if ((undefined1 *)local_2b8._32_8_ != local_2b8 + 0x30) {
            operator_delete((void *)local_2b8._32_8_,CONCAT71(local_2b8._49_7_,local_2b8[0x30]) + 1)
            ;
          }
          if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
            operator_delete((void *)local_2b8._0_8_,CONCAT71(local_2b8._17_7_,local_2b8[0x10]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_dataplus._M_p != &local_360.field_2) {
            operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
          }
        }
      }
      if ((iVar18 != 3) && (iVar18 != 0)) goto LAB_001dd7cf;
    } while (local_370 != local_330);
  }
  parse::anon_class_24_3_f3e5c141::operator()(&local_1d8);
  local_1a8._8_8_ = 0;
  local_1a8._M_unused._M_object = local_338;
  local_198._M_string_length =
       (size_type)
       Catch::clara::std::
       _Function_handler<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::walk_control_(kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kainjow[P]Mustache/mustache.hpp:786:38)>
       ::_M_invoke;
  local_198._M_dataplus._M_p =
       (pointer)Catch::clara::std::
                _Function_handler<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::walk_control_(kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kainjow[P]Mustache/mustache.hpp:786:38)>
                ::_M_manager;
  pcVar17 = (local_1f0->children).
            super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pcVar4 = (local_1f0->children).
           super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pcVar17 != pcVar4) {
    do {
      wVar9 = component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::walk(pcVar17,(walk_callback *)&local_1a8);
      if (wVar9 != walk) break;
      pcVar17 = pcVar17 + 1;
    } while (pcVar17 != pcVar4);
  }
  if ((code *)local_198._M_dataplus._M_p != (code *)0x0) {
    (*(code *)local_198._M_dataplus._M_p)(&local_1a8,&local_1a8,3);
  }
LAB_001dd7cf:
  Catch::clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,
                    CONCAT71(local_230.field_2._M_allocated_capacity._1_7_,
                             local_230.field_2._M_local_buf[0]) + 1);
  }
  if (local_318 != (void *)0x0) {
    operator_delete(local_318,(long)local_308 - (long)local_318);
  }
  if (local_300.
      super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_300.
                    super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_300.
                          super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_300.
                          super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void parse(const string_type& input, context_internal<string_type>& ctx, component<string_type>& root_component, string_type& error_message) const {
        using string_size_type = typename string_type::size_type;
        using streamstring = std::basic_ostringstream<typename string_type::value_type>;

        const string_type brace_delimiter_end_unescaped(3, '}');
        const string_size_type input_size{input.size()};

        bool current_delimiter_is_brace{ctx.delim_set.is_default()};

        std::vector<component<string_type>*> sections{&root_component};
        std::vector<string_size_type> section_starts;
        string_type current_text;
        string_size_type current_text_position = string_type::npos;

        current_text.reserve(input_size);

        const auto process_current_text = [&current_text, &current_text_position, &sections]() {
            if (!current_text.empty()) {
                const component<string_type> comp{current_text, current_text_position};
                sections.back()->children.push_back(comp);
                current_text.clear();
                current_text_position = string_type::npos;
            }
        };

        const std::vector<string_type> whitespace{
            string_type(1, '\r') + string_type(1, '\n'),
            string_type(1, '\n'),
            string_type(1, '\r'),
            string_type(1, ' '),
            string_type(1, '\t'),
        };

        for (string_size_type input_position = 0; input_position != input_size;) {
            bool parse_tag = false;

            if (input.compare(input_position, ctx.delim_set.begin.size(), ctx.delim_set.begin) == 0) {
                process_current_text();

                // Tag start delimiter
                parse_tag = true;
            } else {
                bool parsed_whitespace = false;
                for (const auto& whitespace_text : whitespace) {
                    if (input.compare(input_position, whitespace_text.size(), whitespace_text) == 0) {
                        process_current_text();

                        const component<string_type> comp{whitespace_text, input_position};
                        sections.back()->children.push_back(comp);
                        input_position += whitespace_text.size();

                        parsed_whitespace = true;
                        break;
                    }
                }

                if (!parsed_whitespace) {
                    if (current_text.empty()) {
                        current_text_position = input_position;
                    }
                    current_text.append(1, input[input_position]);
                    input_position++;
                }
            }

            if (!parse_tag) {
                continue;
            }

            // Find the next tag start delimiter
            const string_size_type tag_location_start = input_position;

            // Find the next tag end delimiter
            string_size_type tag_contents_location{tag_location_start + ctx.delim_set.begin.size()};
            const bool tag_is_unescaped_var{current_delimiter_is_brace && tag_location_start != (input_size - 2) && input.at(tag_contents_location) == ctx.delim_set.begin.at(0)};
            const string_type& current_tag_delimiter_end{tag_is_unescaped_var ? brace_delimiter_end_unescaped : ctx.delim_set.end};
            const auto current_tag_delimiter_end_size = current_tag_delimiter_end.size();
            if (tag_is_unescaped_var) {
                ++tag_contents_location;
            }
            const string_size_type tag_location_end{input.find(current_tag_delimiter_end, tag_contents_location)};
            if (tag_location_end == string_type::npos) {
                streamstring ss;
                ss << "Unclosed tag at " << tag_location_start;
                error_message.assign(ss.str());
                return;
            }

            // Parse tag
            const string_type tag_contents{trim(string_type{input, tag_contents_location, tag_location_end - tag_contents_location})};
            component<string_type> comp;
            if (!tag_contents.empty() && tag_contents[0] == '=') {
                if (!parse_set_delimiter_tag(tag_contents, ctx.delim_set)) {
                    streamstring ss;
                    ss << "Invalid set delimiter tag at " << tag_location_start;
                    error_message.assign(ss.str());
                    return;
                }
                current_delimiter_is_brace = ctx.delim_set.is_default();
                comp.tag.type = tag_type::set_delimiter;
                comp.tag.delim_set.reset(new delimiter_set<string_type>(ctx.delim_set));
            }
            if (comp.tag.type != tag_type::set_delimiter) {
                parse_tag_contents(tag_is_unescaped_var, tag_contents, comp.tag);
            }
            comp.position = tag_location_start;
            sections.back()->children.push_back(comp);

            // Start next search after this tag
            input_position = tag_location_end + current_tag_delimiter_end_size;

            // Push or pop sections
            if (comp.tag.is_section_begin()) {
                sections.push_back(&sections.back()->children.back());
                section_starts.push_back(input_position);
            } else if (comp.tag.is_section_end()) {
                if (sections.size() == 1) {
                    streamstring ss;
                    ss << "Unopened section \"" << comp.tag.name << "\" at " << comp.position;
                    error_message.assign(ss.str());
                    return;
                }
                sections.back()->tag.section_text.reset(new string_type(input.substr(section_starts.back(), tag_location_start - section_starts.back())));
                sections.pop_back();
                section_starts.pop_back();
            }
        }

        process_current_text();

        // Check for sections without an ending tag
        root_component.walk_children([&error_message](component<string_type>& comp) -> typename component<string_type>::walk_control {
            if (!comp.tag.is_section_begin()) {
                return component<string_type>::walk_control::walk;
            }
            if (comp.children.empty() || !comp.children.back().tag.is_section_end() || comp.children.back().tag.name != comp.tag.name) {
                streamstring ss;
                ss << "Unclosed section \"" << comp.tag.name << "\" at " << comp.position;
                error_message.assign(ss.str());
                return component<string_type>::walk_control::stop;
            }
            comp.children.pop_back(); // remove now useless end section component
            return component<string_type>::walk_control::walk;
        });
        if (!error_message.empty()) {
            return;
        }
    }